

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::SingleTex2DShader::SingleTex2DShader(SingleTex2DShader *this)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_289;
  allocator<char> local_288;
  allocator<char> local_287;
  allocator<char> local_286;
  allocator<char> local_285;
  FragmentOutput local_284;
  string local_280 [32];
  FragmentSource local_260;
  string local_240 [32];
  VertexSource local_220;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  VertexToFragmentVarying local_1a0;
  Uniform local_198;
  VertexAttribute local_170;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"a_position",&local_285);
  std::__cxx11::string::string((string *)&local_148,local_1c0);
  local_148.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"a_coord",&local_286);
  std::__cxx11::string::string((string *)&local_170,local_1e0);
  local_170.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_170);
  local_1a0.type = GENERICVECTYPE_FLOAT;
  local_1a0.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a0);
  local_284.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_284);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"u_sampler0",&local_287);
  std::__cxx11::string::string((string *)&local_198,local_200);
  local_198.type = TYPE_SAMPLER_2D;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_288);
  std::__cxx11::string::string((string *)&local_220,local_240);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,
             "uniform sampler2D u_sampler0;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_FragColor = texture2D(u_sampler0, v_coord);\n}\n"
             ,&local_289);
  std::__cxx11::string::string((string *)&local_260,local_280);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_260);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_1c0);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e1b950;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e1b988;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e1b9a0;
  return;
}

Assistant:

SingleTex2DShader (void)
		: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
								<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
								<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
								<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
								<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
								<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_2D)
								<< sglr::pdec::VertexSource(
										"attribute highp vec4 a_position;\n"
										"attribute mediump vec2 a_coord;\n"
										"varying mediump vec2 v_coord;\n"
										"void main (void)\n"
										"{\n"
										"	gl_Position = a_position;\n"
										"	v_coord = a_coord;\n"
										"}\n")
								<< sglr::pdec::FragmentSource(
										"uniform sampler2D u_sampler0;\n"
										"varying mediump vec2 v_coord;\n"
										"void main (void)\n"
										"{\n"
										"	gl_FragColor = texture2D(u_sampler0, v_coord);\n"
										"}\n"))
	{
	}